

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BARef::BARef(BARef *this,BARef *rhs)

{
  Box *in_RSI;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *in_RDI;
  
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RSI,in_RDI);
  Box::Box(in_RSI);
  IntVect::IntVect((IntVect *)
                   ((long)&in_RDI[2].super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start + 4));
  std::
  unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::unordered_map((unordered_map<amrex::IntVect,_std::vector<int,_std::allocator<int>_>,_amrex::IntVect::shift_hasher,_std::equal_to<amrex::IntVect>,_std::allocator<std::pair<const_amrex::IntVect,_std::vector<int,_std::allocator<int>_>_>_>_>
                   *)0xfb3498);
  *(undefined1 *)
   &in_RDI[5].super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_start = 0;
  return;
}

Assistant:

BARef::BARef (const BARef& rhs)
    : m_abox(rhs.m_abox) // don't copy hash
{
#ifdef AMREX_MEM_PROFILING
    updateMemoryUsage_box(1);
#endif
}